

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::setFocus(QGraphicsScene *this,FocusReason focusReason)

{
  bool bVar1;
  QGraphicsScenePrivate *pQVar2;
  FocusReason in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QGraphicsScenePrivate *d;
  QFocusEvent event;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsScene *)0x9c598e);
  if (((*(uint *)&pQVar2->field_0xb8 >> 10 & 1) == 0) &&
     (bVar1 = isActive((QGraphicsScene *)in_RDI), bVar1)) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusIn,in_ESI);
    QCoreApplication::sendEvent(in_RDI,(QEvent *)&local_20);
    QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::setFocus(Qt::FocusReason focusReason)
{
    Q_D(QGraphicsScene);
    if (d->hasFocus || !isActive())
        return;
    QFocusEvent event(QEvent::FocusIn, focusReason);
    QCoreApplication::sendEvent(this, &event);
}